

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::Compiler::make_constant_null(Compiler *this,uint32_t id,uint32_t type)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  SPIRConstant *pSVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  SmallVector<unsigned_int,_8UL> elements;
  undefined1 *apuStack_158 [3];
  bool local_139;
  uint32_t local_138;
  uint local_134;
  AlignedBuffer<unsigned_int,_8UL> *local_130;
  SmallVector<unsigned_int,_8UL> local_128 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  apuStack_158[1] = (undefined1 *)0x7c8e75;
  local_138 = type;
  pSVar5 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + type);
  if (pSVar5->pointer == true) {
    apuStack_158[1] = (undefined1 *)0x7c8e91;
    pSVar6 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&>(this,id,&local_138);
    apuStack_158[1] = (undefined1 *)0x7c8ea5;
    memset(local_128,0,0xf8);
    lVar7 = 0x30;
    do {
      *(undefined8 *)((long)&local_138 + lVar7) = 0;
      *(undefined8 *)((long)&local_130 + lVar7) = 0;
      pcVar1 = local_128[0].stack_storage.aligned_char + lVar7 + -0x18;
      pcVar1[0] = '\x01';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      *(undefined8 *)((long)apuStack_158 + lVar7) = 0;
      *(undefined8 *)((long)apuStack_158 + lVar7 + 8) = 0;
      *(undefined8 *)((long)apuStack_158 + lVar7 + 0x10) = 0;
      *(undefined8 *)(&stack0xfffffffffffffec0 + lVar7) = 0;
      lVar7 = lVar7 + 0x38;
    } while (lVar7 != 0x110);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 1;
    apuStack_158[1] = (undefined1 *)0x7c8ef9;
    memcpy(&pSVar6->m,local_128,0xf4);
    (pSVar6->m).columns = pSVar5->columns;
    uVar4 = pSVar5->vecsize;
    lVar7 = -0xe0;
    do {
      *(uint32_t *)((pSVar6->subconstants).stack_storage.aligned_char + lVar7 + -8) = uVar4;
      lVar7 = lVar7 + 0x38;
    } while (lVar7 != 0);
  }
  else {
    if ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      sVar3 = (pSVar5->member_types).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar3 == 0) {
        apuStack_158[1] = (undefined1 *)0x7c90ef;
        pSVar6 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&>(this,id,&local_138);
        apuStack_158[1] = (undefined1 *)0x7c9103;
        memset(local_128,0,0xf8);
        lVar7 = 0x30;
        do {
          *(undefined8 *)((long)&local_138 + lVar7) = 0;
          *(undefined8 *)((long)&local_130 + lVar7) = 0;
          pcVar1 = local_128[0].stack_storage.aligned_char + lVar7 + -0x18;
          pcVar1[0] = '\x01';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          *(undefined8 *)((long)apuStack_158 + lVar7) = 0;
          *(undefined8 *)((long)apuStack_158 + lVar7 + 8) = 0;
          *(undefined8 *)((long)apuStack_158 + lVar7 + 0x10) = 0;
          *(undefined8 *)(&stack0xfffffffffffffec0 + lVar7) = 0;
          lVar7 = lVar7 + 0x38;
        } while (lVar7 != 0x110);
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 1;
        apuStack_158[1] = (undefined1 *)0x7c9157;
        memcpy(&pSVar6->m,local_128,0xf4);
        (pSVar6->m).columns = pSVar5->columns;
        uVar4 = pSVar5->vecsize;
        lVar7 = -0xe0;
        do {
          *(uint32_t *)((pSVar6->subconstants).stack_storage.aligned_char + lVar7 + -8) = uVar4;
          lVar7 = lVar7 + 0x38;
        } while (lVar7 != 0);
        return;
      }
      apuStack_158[1] = (undefined1 *)0x7c9019;
      uVar4 = ParsedIR::increase_bound_by(&this->ir,(uint32_t)sVar3);
      local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
      local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
      local_128[0].buffer_capacity = 8;
      apuStack_158[1] = (undefined1 *)0x7c9045;
      SmallVector<unsigned_int,_8UL>::resize
                (local_128,
                 (pSVar5->member_types).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
                 buffer_size);
      if ((pSVar5->member_types).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
          buffer_size != 0) {
        uVar8 = 0;
        uVar10 = 1;
        do {
          apuStack_158[1] = (undefined1 *)0x7c906e;
          make_constant_null(this,uVar4,
                             (pSVar5->member_types).
                             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                             .ptr[uVar8].id);
          *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar8 * 4) = uVar4
          ;
          uVar4 = uVar4 + 1;
          bVar2 = uVar10 < (pSVar5->member_types).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                           .buffer_size;
          uVar8 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar2);
      }
      local_130 = (AlignedBuffer<unsigned_int,_8UL> *)
                  local_128[0].super_VectorView<unsigned_int>.ptr;
      local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
      local_139 = false;
      apuStack_158[1] = (undefined1 *)0x7c90ba;
      set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                (this,id,&local_138,(uint **)&local_130,&local_134,&local_139);
    }
    else {
      if ((pSVar5->parent_type).id == 0) {
        apuStack_158[1] = &LAB_007c91aa;
        __assert_fail("constant_type.parent_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                      ,0x132e,
                      "void diligent_spirv_cross::Compiler::make_constant_null(uint32_t, uint32_t)")
        ;
      }
      uVar9 = 1;
      apuStack_158[1] = (undefined1 *)0x7c8f4c;
      uVar4 = ParsedIR::increase_bound_by(&this->ir,1);
      apuStack_158[1] = (undefined1 *)0x7c8f5f;
      make_constant_null(this,uVar4,(pSVar5->parent_type).id);
      bVar2 = (pSVar5->array_size_literal).super_VectorView<bool>.ptr
              [(pSVar5->array_size_literal).super_VectorView<bool>.buffer_size - 1];
      if (bVar2 == true) {
        uVar9 = (pSVar5->array).super_VectorView<unsigned_int>.ptr
                [(pSVar5->array).super_VectorView<unsigned_int>.buffer_size - 1];
      }
      local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
      local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
      local_128[0].buffer_capacity = 8;
      apuStack_158[1] = (undefined1 *)0x7c8fa7;
      SmallVector<unsigned_int,_8UL>::resize(local_128,(ulong)uVar9);
      if (uVar9 != 0) {
        uVar8 = 0;
        do {
          *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar8 * 4) = uVar4
          ;
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      local_130 = (AlignedBuffer<unsigned_int,_8UL> *)
                  local_128[0].super_VectorView<unsigned_int>.ptr;
      local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
      local_139 = false;
      apuStack_158[1] = (undefined1 *)0x7c8ff0;
      pSVar6 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                         (this,id,&local_138,(uint **)&local_130,&local_134,&local_139);
      pSVar6->is_null_array_specialized_length = (bool)(bVar2 ^ 1);
    }
    local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr !=
        &local_128[0].stack_storage) {
      apuStack_158[1] = (undefined1 *)0x7c90db;
      free(local_128[0].super_VectorView<unsigned_int>.ptr);
    }
  }
  return;
}

Assistant:

void Compiler::make_constant_null(uint32_t id, uint32_t type)
{
	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		auto &constant = set<SPIRConstant>(id, type);
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = ir.increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type);

		// The array size of OpConstantNull can be either literal or specialization constant.
		// In the latter case, we cannot take the value as-is, as it can be changed to anything.
		// Rather, we assume it to be *one* for the sake of initializer.
		bool is_literal_array_size = constant_type.array_size_literal.back();
		uint32_t count = is_literal_array_size ? constant_type.array.back() : 1;
		SmallVector<uint32_t> elements(count);
		for (uint32_t i = 0; i < count; i++)
			elements[i] = parent_id;
		auto &constant = set<SPIRConstant>(id, type, elements.data(), uint32_t(elements.size()), false);
		constant.is_null_array_specialized_length = !is_literal_array_size;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = ir.increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i]);
			elements[i] = member_ids + i;
		}
		set<SPIRConstant>(id, type, elements.data(), uint32_t(elements.size()), false);
	}
	else
	{
		auto &constant = set<SPIRConstant>(id, type);
		constant.make_null(constant_type);
	}
}